

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DataView * __thiscall
Js::JavascriptLibrary::CreateDataView
          (JavascriptLibrary *this,ArrayBufferBase *arrayBuffer,uint32 offset,uint32 length)

{
  uint32 mappedLength;
  uint32 byteoffset;
  ArrayBufferBase *arrayBuffer_00;
  Recycler *pRVar1;
  DataView *this_00;
  DynamicType **ppDVar2;
  TrackAllocData local_50;
  DataView *dataView;
  uint32 length_local;
  uint32 offset_local;
  ArrayBufferBase *arrayBuffer_local;
  JavascriptLibrary *this_local;
  
  dataView._0_4_ = length;
  dataView._4_4_ = offset;
  _length_local = arrayBuffer;
  arrayBuffer_local = (ArrayBufferBase *)this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&DataView::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x17ec);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this_00 = (DataView *)new<Memory::Recycler>(0x40,pRVar1,0x43c4b0);
  arrayBuffer_00 = _length_local;
  byteoffset = dataView._4_4_;
  mappedLength = (uint32)dataView;
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)&this->dataViewType);
  DataView::DataView(this_00,arrayBuffer_00,byteoffset,mappedLength,*ppDVar2);
  return this_00;
}

Assistant:

DataView* JavascriptLibrary::CreateDataView(ArrayBufferBase* arrayBuffer, uint32 offset, uint32 length)
    {
        DataView* dataView = RecyclerNew(this->GetRecycler(), DataView, arrayBuffer, offset, length, dataViewType);

        return dataView;
    }